

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O0

char * IoTHubAccount_GetSharedAccessSignature(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)

{
  int iVar1;
  time_t tVar2;
  STRING_HANDLE key;
  STRING_HANDLE scope;
  STRING_HANDLE keyName_00;
  STRING_HANDLE handle;
  char *source;
  STRING_HANDLE sasHandle;
  STRING_HANDLE keyName;
  STRING_HANDLE iotName;
  STRING_HANDLE accessKey;
  size_t expiry_time;
  time_t currentTime;
  IOTHUB_ACCOUNT_INFO *acctInfo;
  char *result;
  IOTHUB_ACCOUNT_INFO_HANDLE acctHandle_local;
  
  acctInfo = (IOTHUB_ACCOUNT_INFO *)0x0;
  if (acctHandle == (IOTHUB_ACCOUNT_INFO_HANDLE)0x0) {
    acctInfo = (IOTHUB_ACCOUNT_INFO *)0x0;
  }
  else if (acctHandle->sharedAccessToken == (char *)0x0) {
    tVar2 = time((time_t *)0x0);
    key = STRING_construct(acctHandle->sharedAccessKey);
    scope = STRING_construct(acctHandle->hostname);
    keyName_00 = STRING_construct(acctHandle->keyName);
    if (((key != (STRING_HANDLE)0x0) && (scope != (STRING_HANDLE)0x0)) &&
       (keyName_00 != (STRING_HANDLE)0x0)) {
      handle = SASToken_Create(key,scope,keyName_00,tVar2 + 0xe10);
      if (handle == (STRING_HANDLE)0x0) {
        acctInfo = (IOTHUB_ACCOUNT_INFO *)0x0;
      }
      else {
        source = STRING_c_str(handle);
        iVar1 = mallocAndStrcpy_s(&acctHandle->sharedAccessToken,source);
        if (iVar1 == 0) {
          acctInfo = (IOTHUB_ACCOUNT_INFO *)acctHandle->sharedAccessToken;
        }
        else {
          acctInfo = (IOTHUB_ACCOUNT_INFO *)0x0;
        }
        STRING_delete(handle);
      }
    }
    STRING_delete(key);
    STRING_delete(scope);
    STRING_delete(keyName_00);
  }
  else {
    acctInfo = (IOTHUB_ACCOUNT_INFO *)acctHandle->sharedAccessToken;
  }
  return (char *)acctInfo;
}

Assistant:

const char* IoTHubAccount_GetSharedAccessSignature(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)
{
    const char* result = NULL;
    IOTHUB_ACCOUNT_INFO* acctInfo = (IOTHUB_ACCOUNT_INFO*)acctHandle;
    if (acctInfo != NULL)
    {
        if (acctInfo->sharedAccessToken != NULL)
        {
            // Reuse the sharedAccessToken if it's been created already
            result = acctInfo->sharedAccessToken;
        }
        else
        {
        time_t currentTime = time(NULL);
        size_t expiry_time = (size_t)(currentTime + 3600);

        STRING_HANDLE accessKey = STRING_construct(acctInfo->sharedAccessKey);
        STRING_HANDLE iotName = STRING_construct(acctInfo->hostname);
        STRING_HANDLE keyName = STRING_construct(acctInfo->keyName);
        if (accessKey != NULL && iotName != NULL && keyName != NULL)
        {
            STRING_HANDLE sasHandle = SASToken_Create(accessKey, iotName, keyName, expiry_time);
            if (sasHandle == NULL)
            {

                result = NULL;
            }
            else
            {
                if (mallocAndStrcpy_s(&acctInfo->sharedAccessToken, STRING_c_str(sasHandle)) != 0)
                {
                    result = NULL;
                }
                else
                {
                    result = acctInfo->sharedAccessToken;
                }
                STRING_delete(sasHandle);
            }
        }
        STRING_delete(accessKey);
        STRING_delete(iotName);
        STRING_delete(keyName);
    }
    }
    else
    {
        result = NULL;
    }
    return result;
}